

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexExpanderShader::shadeVertices
          (VertexExpanderShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  VertexPacket *pVVar1;
  Vector<float,_4> local_48;
  undefined8 local_38;
  undefined8 local_30;
  int local_28;
  int local_24;
  int ndx;
  int numPackets_local;
  VertexPacket **packets_local;
  VertexAttrib *inputs_local;
  VertexExpanderShader *this_local;
  
  local_24 = numPackets;
  _ndx = packets;
  packets_local = (VertexPacket **)inputs;
  inputs_local = (VertexAttrib *)this;
  for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
    rr::readVertexAttribFloat
              ((rr *)&local_38,(VertexAttrib *)packets_local,_ndx[local_28]->instanceNdx,
               _ndx[local_28]->vertexNdx);
    pVVar1 = _ndx[local_28];
    *(undefined8 *)(pVVar1->position).m_data = local_38;
    *(undefined8 *)((pVVar1->position).m_data + 2) = local_30;
    _ndx[local_28]->pointSize = 1.0;
    rr::readVertexAttribFloat
              ((rr *)&local_48,(VertexAttrib *)(packets_local + 5),_ndx[local_28]->instanceNdx,
               _ndx[local_28]->vertexNdx);
    rr::GenericVec4::operator=(_ndx[local_28]->outputs,&local_48);
  }
  return;
}

Assistant:

void VertexExpanderShader::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	for (int ndx = 0; ndx < numPackets; ++ndx)
	{
		packets[ndx]->position = rr::readVertexAttribFloat(inputs[0], packets[ndx]->instanceNdx, packets[ndx]->vertexNdx);
		packets[ndx]->pointSize = 1.0f;
		packets[ndx]->outputs[0] = rr::readVertexAttribFloat(inputs[1], packets[ndx]->instanceNdx, packets[ndx]->vertexNdx);
	}
}